

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__shiftsigned(uint v,int shift,int bits)

{
  uint uVar1;
  
  uVar1 = v >> (shift & 0x1fU);
  if (shift < 0) {
    uVar1 = v << ((byte)-(char)shift & 0x1f);
  }
  if (uVar1 < 0x100) {
    if (-1 < bits) {
      return (int)((uVar1 >> ((byte)(8 - (char)bits) & 0x1f)) *
                  stbi__shiftsigned::mul_table[(uint)bits]) >>
             ((byte)stbi__shiftsigned::shift_table[(uint)bits] & 0x1f);
    }
    pbrt::LogFatal<char_const(&)[23]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
               ,0x1490,"Check failed: %s",(char (*) [23])"bits >= 0 && bits <= 8");
  }
  pbrt::LogFatal<char_const(&)[8]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
             ,0x148e,"Check failed: %s",(char (*) [8])"v < 256");
}

Assistant:

static int stbi__shiftsigned(unsigned int v, int shift, int bits)
{
   static unsigned int mul_table[9] = {
      0,
      0xff/*0b11111111*/, 0x55/*0b01010101*/, 0x49/*0b01001001*/, 0x11/*0b00010001*/,
      0x21/*0b00100001*/, 0x41/*0b01000001*/, 0x81/*0b10000001*/, 0x01/*0b00000001*/,
   };
   static unsigned int shift_table[9] = {
      0, 0,0,1,0,2,4,6,0,
   };
   if (shift < 0)
      v <<= -shift;
   else
      v >>= shift;
   STBI_ASSERT(v < 256);
   v >>= (8-bits);
   STBI_ASSERT(bits >= 0 && bits <= 8);
   return (int) ((unsigned) v * mul_table[bits]) >> shift_table[bits];
}